

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O3

bool runArmips(ArmipsArguments *settings)

{
  pointer pLVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  int iVar5;
  ExpressionFunctionHandler *pEVar6;
  pointer pEVar7;
  byte bVar8;
  pointer *__ptr;
  long lVar9;
  ulong uVar10;
  LabelDefinition *label;
  pointer this;
  pointer name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  int64_t startSharedFreePosition;
  int64_t startFreePosition;
  SymbolData symData;
  Token token;
  Parser parser;
  TextFile input;
  TempData tempData;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_7d8;
  undefined1 local_7d0 [152];
  SymbolData local_738;
  Token local_6d8;
  undefined1 local_670 [24];
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  local_658;
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  local_628;
  pointer local_5d8;
  pointer local_5c8;
  TextFile local_5c0;
  TextFile local_2f8;
  
  Global.Section = 0;
  Global.nocash = false;
  Global.relativeInclude = false;
  Global.FileInfo.TotalLineCount = 0;
  Global.multiThreading = true;
  Architecture::setCurrent(&InvalidArchitecture.super_Architecture);
  pvVar3 = Tokenizer::equValues.
           super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = Tokenizer::equValues.
           super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this = Tokenizer::equValues.
         super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (Tokenizer::equValues.
      super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Tokenizer::equValues.
      super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      std::vector<Token,_std::allocator<Token>_>::~vector(this);
      this = this + 1;
    } while (this != pvVar3);
    Tokenizer::equValues.
    super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  Logger::clear();
  Allocations::clear();
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  FileList::clear(&Global.fileList);
  Global.FileInfo.TotalLineCount = 0;
  Global.FileInfo.FileNum = 0;
  Global.FileInfo.LineNumber = 0;
  CArmArchitecture::clear(&Arm);
  pEVar6 = ExpressionFunctionHandler::instance();
  ExpressionFunctionHandler::reset(pEVar6);
  pEVar6 = ExpressionFunctionHandler::instance();
  registerExpressionFunctions(pEVar6);
  Parser::Parser((Parser *)local_670);
  SymbolData::SymbolData((SymbolData *)(local_7d0 + 0x98));
  TextFile::TextFile(&local_2f8);
  Logger::silent = settings->silent;
  Logger::errorOnWarning = settings->errorOnWarning;
  bVar4 = ghc::filesystem::path::empty(&settings->symFileName);
  if (!bVar4) {
    iVar5 = settings->symFileVersion;
    ghc::filesystem::path::operator=((path *)(local_7d0 + 0x98),&settings->symFileName);
    local_738.nocashSymVersion = iVar5;
  }
  bVar4 = ghc::filesystem::path::empty(&settings->tempFileName);
  if (!bVar4) {
    ghc::filesystem::path::operator=(&local_2f8.fileName,&settings->tempFileName);
  }
  local_6d8.originalText._M_dataplus._M_p = (pointer)&local_6d8.originalText.field_2;
  local_6d8.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  local_6d8.line = 0;
  local_6d8.column._0_5_ = 0;
  local_6d8.column._5_3_ = 0;
  local_6d8.type = Invalid;
  local_6d8.checked = false;
  local_6d8.originalText._M_string_length = 0;
  local_6d8.originalText.field_2._M_local_buf[0] = '\0';
  pEVar7 = (settings->equList).
           super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((settings->equList).
      super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar7) {
    lVar9 = 0x20;
    uVar10 = 0;
    do {
      Parser::addEquation((Parser *)local_670,&local_6d8,
                          (Identifier *)((long)pEVar7 + lVar9 + -0x20),
                          (string *)((long)&(pEVar7->name)._name._M_dataplus._M_p + lVar9));
      uVar10 = uVar10 + 1;
      pEVar7 = (settings->equList).
               super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x40;
    } while (uVar10 < (ulong)((long)(settings->equList).
                                    super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7 >> 6))
    ;
  }
  SymbolTable::addLabels(&Global.symbolTable,&settings->labels);
  name = (settings->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (settings->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (name != pLVar1) {
    do {
      SymbolData::addLabel((SymbolData *)(local_7d0 + 0x98),name->value,(string *)name);
      name = name + 1;
    } while (name != pLVar1);
  }
  if (Logger::error != false) {
    bVar4 = false;
    goto LAB_00129353;
  }
  TextFile::TextFile(&local_5c0);
  if (settings->mode == FILE) {
    Global.memoryMode = false;
    iVar5 = TextFile::open(&local_5c0,(char *)&settings->inputFileName,0,5);
    if ((char)iVar5 != '\0') goto LAB_0012911e;
    Logger::printError<>(Error,"Could not open file");
    bVar4 = false;
  }
  else {
    if (settings->mode == MEMORY) {
      Global.memoryMode = true;
      Global.memoryFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (settings->memoryFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&Global.memoryFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(settings->memoryFile).
                  super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      TextFile::openMemory(&local_5c0,&settings->content);
    }
LAB_0012911e:
    Parser::parseFile((Parser *)local_7d0,(TextFile *)local_670,SUB81(&local_5c0,0));
    Logger::printQueue();
    if (Logger::error == false) {
      if ((CAssemblerCommand *)local_7d0._0_8_ == (CAssemblerCommand *)0x0) {
        bVar4 = true;
      }
      else {
        local_7d8._M_head_impl = (CAssemblerCommand *)local_7d0._0_8_;
        local_7d0._0_8_ = (CAssemblerCommand *)0x0;
        bVar4 = encodeAssembly((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                *)&local_7d8,(SymbolData *)(local_7d0 + 0x98),(TempData *)&local_2f8
                              );
        if (local_7d8._M_head_impl != (CAssemblerCommand *)0x0) {
          (*(local_7d8._M_head_impl)->_vptr_CAssemblerCommand[1])();
        }
        local_7d8._M_head_impl = (CAssemblerCommand *)0x0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      if (Global.memoryMode == false) {
        Logger::printError<>(Warning,"File not closed");
      }
      FileManager::closeFile(g_fileManager);
    }
    if (settings->errorsResult !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_7d0 + 8),&Logger::errors_abi_cxx11_);
      if (local_7d0._16_8_ != local_7d0._8_8_) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(settings->errorsResult,
                      (value_type *)((long)(Tokenizer **)local_7d0._8_8_ + lVar9));
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (ulong)((long)(local_7d0._16_8_ - local_7d0._8_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_7d0 + 8));
    }
    if (settings->showStats == true) {
      Allocations::collectStats();
      Logger::printLine<long,long>
                ("Total areas and regions: %lld / %lld",(long *)(local_7d0 + 0x58),
                 (long *)(local_7d0 + 0x50));
      Logger::printLine<long,long>
                ("Total regions: %lld / %lld",(long *)(local_7d0 + 0x68),(long *)(local_7d0 + 0x60))
      ;
      Logger::printLine<long,long,long>
                ("Largest area or region: 0x%08llX, %lld / %lld",(long *)(local_7d0 + 8),
                 (long *)(local_7d0 + 0x18),(long *)(local_7d0 + 0x10));
      local_7d0._144_8_ = (long)(_Rb_tree_color *)local_7d0._48_8_ + local_7d0._32_8_;
      Logger::printLine<long,long,long,long>
                ("Most free area or region: 0x%08llX, %lld / %lld (free at 0x%08llX)",
                 (long *)(local_7d0 + 0x20),(long *)(local_7d0 + 0x30),(long *)(local_7d0 + 0x28),
                 (long *)(local_7d0 + 0x90));
      local_7d0._136_8_ = (long)(_Rb_tree_color *)local_7d0._56_8_ + local_7d0._72_8_;
      Logger::printLine<long,long,long,long>
                ("Most free region: 0x%08llX, %lld / %lld (free at 0x%08llX)",
                 (long *)(local_7d0 + 0x38),(long *)(local_7d0 + 0x48),(long *)(local_7d0 + 0x40),
                 (long *)(local_7d0 + 0x88));
      if (local_7d0._128_8_ != 0) {
        Logger::printLine<long>("Total pool size: %lld",(long *)(local_7d0 + 0x80));
        Logger::printLine<long,long>
                  ("Largest pool: 0x%08llX, %lld",(long *)(local_7d0 + 0x70),
                   (long *)(local_7d0 + 0x78));
      }
    }
    bVar8 = Logger::error ^ 1;
    if ((CAssemblerCommand *)local_7d0._0_8_ != (CAssemblerCommand *)0x0) {
      (*(*(_func_int ***)local_7d0._0_8_)[1])();
    }
    bVar4 = (bool)(bVar4 & bVar8);
  }
  TextFile::~TextFile(&local_5c0);
LAB_00129353:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8.originalText._M_dataplus._M_p != &local_6d8.originalText.field_2) {
    operator_delete(local_6d8.originalText._M_dataplus._M_p,
                    CONCAT71(local_6d8.originalText.field_2._M_allocated_capacity._1_7_,
                             local_6d8.originalText.field_2._M_local_buf[0]) + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_6d8.value);
  TextFile::~TextFile(&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_738.files);
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::~vector(&local_738.modules);
  ghc::filesystem::path::~path((path *)(local_7d0 + 0x98));
  if (local_5d8 != (pointer)0x0) {
    operator_delete(local_5d8,(long)local_5c8 - (long)local_5d8);
  }
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&local_628);
  std::
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  ::~_Rb_tree(&local_658);
  if ((pointer)local_670._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ - local_670._0_8_);
  }
  return bVar4;
}

Assistant:

bool runArmips(ArmipsArguments& settings)
{
	// initialize and reset global data
	Global.Section = 0;
	Global.nocash = false;
	Global.FileInfo.TotalLineCount = 0;
	Global.relativeInclude = false;
	Global.multiThreading = true;
	Architecture::setCurrent(InvalidArchitecture);

	Tokenizer::clearEquValues();
	Logger::clear();
	Allocations::clear();
	Global.Table.clear();
	Global.symbolTable.clear();

	Global.fileList.clear();
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	ExpressionFunctionHandler::instance().reset();
	registerExpressionFunctions(ExpressionFunctionHandler::instance());

	// process settings
	Parser parser;
	SymbolData symData;
	TempData tempData;
	
	Logger::setSilent(settings.silent);
	Logger::setErrorOnWarning(settings.errorOnWarning);

	if (!settings.symFileName.empty())
		symData.setNocashSymFileName(settings.symFileName, settings.symFileVersion);

	if (!settings.tempFileName.empty())
		tempData.setFileName(settings.tempFileName);

	Token token;
	for (size_t i = 0; i < settings.equList.size(); i++)
	{
		parser.addEquation(token, settings.equList[i].name, settings.equList[i].value);
	}

	Global.symbolTable.addLabels(settings.labels);
	for (const LabelDefinition& label : settings.labels)
	{
		symData.addLabel(label.value, label.name.string());
	}

	if (Logger::hasError())
		return false;

	// run assembler
	TextFile input;
	switch (settings.mode)
	{
	case ArmipsMode::FILE:
		Global.memoryMode = false;		
		if (!input.open(settings.inputFileName,TextFile::Read))
		{
			Logger::printError(Logger::Error, "Could not open file");
			return false;
		}
		break;
	case ArmipsMode::MEMORY:
		Global.memoryMode = true;
		Global.memoryFile = settings.memoryFile;
		input.openMemory(settings.content);
		break;
	}

	std::unique_ptr<CAssemblerCommand> content = parser.parseFile(input);
	Logger::printQueue();

	bool result = !Logger::hasError();
	if (result && content != nullptr)
		result = encodeAssembly(std::move(content), symData, tempData);
	
	if (g_fileManager->hasOpenFile())
	{
		if (!Global.memoryMode)
			Logger::printError(Logger::Warning, "File not closed");
		g_fileManager->closeFile();
	}

	// return errors
	if (settings.errorsResult != nullptr)
	{
		std::vector<std::string> errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			settings.errorsResult->push_back(errors[i]);
	}

	if (settings.showStats)
		printStats(Allocations::collectStats());

	if (Logger::hasError())
	{
		return false;
	}

	return result;
}